

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O3

time_t __thiscall QDateTime::time(QDateTime *this,time_t *__timer)

{
  QDateTimePrivate *pQVar1;
  ulong uVar2;
  
  pQVar1 = (this->d).d;
  if (((ulong)pQVar1 & 1) == 0) {
    if (((pQVar1->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
         super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i & 4) == 0) {
      return 0xffffffff;
    }
    uVar2 = pQVar1->m_msecs;
  }
  else {
    if (((ulong)pQVar1 & 4) == 0) {
      return 0xffffffff;
    }
    uVar2 = (long)pQVar1 >> 8;
  }
  if (-1 < (long)uVar2) {
    return uVar2 % 86400000;
  }
  return ((~uVar2 / 86400000) * 86400000 - ~uVar2) + 86399999;
}

Assistant:

QTime QDateTime::time() const
{
    return getStatus(d).testFlag(QDateTimePrivate::ValidTime) ? msecsToTime(getMSecs(d)) : QTime();
}